

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

boolean check_room(level *lev,xchar *lowx,xchar *ddx,xchar *lowy,xchar *ddy,boolean vault)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  schar *psVar9;
  uint uVar10;
  ulong uVar11;
  char cVar12;
  char cVar13;
  uint uVar14;
  int iVar15;
  
  cVar12 = *lowx;
  cVar13 = *ddx;
  cVar1 = *lowy;
  cVar2 = *ddy;
  if (cVar12 < 3) {
    *lowx = '\x03';
  }
  iVar4 = (int)cVar13 + (int)cVar12;
  if (*lowy < '\x02') {
    *lowy = '\x02';
  }
  iVar15 = 0x4d;
  if (iVar4 < 0x4d) {
    iVar15 = iVar4;
  }
  cVar12 = *lowx;
  iVar4 = (int)cVar12;
  bVar3 = '\0';
  if (iVar4 < iVar15) {
    iVar8 = 4 - (uint)(vault == '\0');
    uVar5 = vault == '\0' ^ 5;
    iVar7 = 0x12;
    if ((int)cVar2 + (int)cVar1 < 0x12) {
      iVar7 = (int)cVar2 + (int)cVar1;
    }
LAB_00249952:
    if (*lowy < iVar7) {
      uVar14 = iVar4 - uVar5;
      if ((int)uVar14 <= (int)(uVar5 + iVar15)) {
        uVar10 = *lowy - iVar8;
        uVar11 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar11 = 0;
        }
        iVar4 = iVar7 + iVar8;
        if (0x13 < iVar7 + iVar8) {
          iVar4 = 0x14;
        }
        do {
          if ((0xffffffb0 < uVar14 - 0x50) && ((int)uVar11 <= iVar4)) {
            psVar9 = &lev->locations[uVar14][uVar11].typ;
            iVar6 = (int)uVar11 + -1;
            cVar13 = (char)iVar8 + (char)uVar11;
            do {
              cVar13 = cVar13 + '\x01';
              if (*psVar9 != '\0') {
                uVar10 = mt_random();
                if (uVar10 * -0x55555555 < 0x55555556) goto LAB_00249a65;
                if ((int)uVar14 < (int)*lowx) {
                  *lowx = (char)uVar14 + (char)uVar5 + '\x01';
                }
                else {
                  iVar15 = uVar14 + ~uVar5;
                }
                if (iVar6 + 1 < (int)*lowy) {
                  *lowy = cVar13;
                }
                else {
                  iVar7 = iVar6 - iVar8;
                }
                cVar12 = *lowx;
                iVar4 = (int)cVar12;
                if (iVar4 < iVar15) goto LAB_00249952;
                goto LAB_00249a65;
              }
              psVar9 = psVar9 + 0xc;
              iVar6 = iVar6 + 1;
            } while (iVar6 < iVar4);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar5 + 1 + iVar15);
      }
      *ddx = (char)iVar15 - cVar12;
      *ddy = (char)iVar7 - *lowy;
      bVar3 = '\x01';
    }
    else {
LAB_00249a65:
      bVar3 = '\0';
    }
  }
  return bVar3;
}

Assistant:

boolean check_room(struct level *lev, xchar *lowx, xchar *ddx,
		   xchar *lowy, xchar *ddy, boolean vault)
{
	int x, y, hix = *lowx + *ddx, hiy = *lowy + *ddy;
	struct rm *loc;
	int xlim, ylim, ymax;

	xlim = XLIM + (vault ? 1 : 0);
	ylim = YLIM + (vault ? 1 : 0);

	if (*lowx < 3)		*lowx = 3;
	if (*lowy < 2)		*lowy = 2;
	if (hix > COLNO-3)	hix = COLNO - 3;
	if (hiy > ROWNO-3)	hiy = ROWNO - 3;
chk:
	if (hix <= *lowx || hiy <= *lowy)	return FALSE;

	/* check area around room (and make room smaller if necessary) */
	for (x = *lowx - xlim; x <= hix + xlim; x++) {
		if (x <= 0 || x >= COLNO) continue;
		y = *lowy - ylim;
		ymax = hiy + ylim;
		if (y < 0)
		    y = 0;
		if (ymax >= ROWNO)
		    ymax = ROWNO - 1;
		loc = &lev->locations[x][y];
		
		for (; y <= ymax; y++) {
			if (loc++->typ) {
				if (!rn2(3))
				    return FALSE;

				if (x < *lowx)
				    *lowx = x + xlim + 1;
				else
				    hix = x - xlim - 1;
				if (y < *lowy)
				    *lowy = y + ylim + 1;
				else
				    hiy = y - ylim - 1;
				goto chk;
			}
		}
	}
	*ddx = hix - *lowx;
	*ddy = hiy - *lowy;
	return TRUE;
}